

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_manager.c
# Opt level: O0

int create_terminal_specific_directory(char *table_dir,char *terminal_id)

{
  int *piVar1;
  char local_138 [4];
  int status;
  char dirname [268];
  char *terminal_id_local;
  char *table_dir_local;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  snprintf(local_138,0x10c,"%s/%s",table_dir,terminal_id);
  table_dir_local._4_4_ = mkdir(local_138,0x1ed);
  if ((table_dir_local._4_4_ != 0) && (piVar1 = __errno_location(), *piVar1 != 0x11)) {
    fprintf(_stderr,"%s: Failed to create directory: %s\n","create_terminal_specific_directory",
            local_138);
    table_dir_local._4_4_ = -2;
  }
  return table_dir_local._4_4_;
}

Assistant:

static int create_terminal_specific_directory(char *table_dir, char *terminal_id) {
    char dirname[268];
    int  status = 0;

    errno = 0;

    snprintf(dirname, sizeof(dirname), "%s/%s", table_dir, terminal_id);

#ifdef _WIN32
    status = _mkdir(dirname);
#else  /* ifdef _WIN32 */
    status = mkdir(dirname, 0755);
#endif /* ifdef _WIN32 */

    if ((status != 0) && (errno != EEXIST)) {
        fprintf(stderr, "%s: Failed to create directory: %s\n", __func__, dirname);
        return -ENOENT;
    }

    return status;
}